

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemViewPrivate::clearOrRemove(QAbstractItemViewPrivate *this)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  QItemSelectionRange *pQVar7;
  long in_FS_OFFSET;
  QMap<int,_QVariant> roles;
  QMap<int,_QVariant> local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QArrayData *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QArrayDataPointer<QItemSelectionRange> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selection();
  if (this->overwrite == false) {
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      pQVar7 = local_78.ptr;
      do {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent();
        iVar2 = QPersistentModelIndex::column();
        if (iVar2 == 0) {
          iVar2 = QPersistentModelIndex::column();
          iVar3 = (**(code **)(*(long *)this->model + 0x80))(this->model,&local_58);
          if (iVar2 == iVar3 + -1) {
            iVar2 = QPersistentModelIndex::row();
            iVar3 = QPersistentModelIndex::row();
            pQVar1 = this->model;
            uVar4 = QPersistentModelIndex::row();
            (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,uVar4,(iVar2 - iVar3) + 1,&local_58);
          }
        }
        pQVar7 = pQVar7 + 1;
      } while (pQVar7 != local_78.ptr + local_78.size);
    }
  }
  else {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::indexes();
    if (local_88 != (undefined1 *)0x0) {
      puVar6 = (undefined1 *)0x0;
      do {
        local_b8 = *(undefined8 *)(puStack_90 + (long)puVar6 * 0x18);
        uStack_b0 = *(undefined8 *)((long)(puStack_90 + (long)puVar6 * 0x18) + 8);
        local_a8 = *(undefined8 *)(puStack_90 + (long)puVar6 * 0x18 + 0x10);
        local_c0.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )&DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)this->model + 0xb0))(&local_c0);
        QMap<int,_QVariant>::detach(&local_c0);
        p_Var5 = *(_Base_ptr *)((long)local_c0.d.d.ptr + 0x20);
        while( true ) {
          QMap<int,_QVariant>::detach(&local_c0);
          if (p_Var5 == (_Rb_tree_node_base *)((long)local_c0.d.d.ptr + 0x10)) break;
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = (undefined1 *)0x0;
          local_58._16_8_ = (undefined1 *)0x0;
          local_40 = 2;
          ::QVariant::operator=((QVariant *)&p_Var5[1]._M_parent,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        }
        (**(code **)(*(long *)this->model + 0xb8))(this->model,&local_b8,&local_c0);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_c0.d);
        puVar6 = puVar6 + 1;
      } while (puVar6 < local_88);
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,0x18,0x10);
      }
    }
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::clearOrRemove()
{
#if QT_CONFIG(draganddrop)
    const QItemSelection selection = selectionModel->selection();
    QList<QItemSelectionRange>::const_iterator it = selection.constBegin();

    if (!overwrite) {
        for (; it != selection.constEnd(); ++it) {
            QModelIndex parent = (*it).parent();
            if ((*it).left() != 0)
                continue;
            if ((*it).right() != (model->columnCount(parent) - 1))
                continue;
            int count = (*it).bottom() - (*it).top() + 1;
            model->removeRows((*it).top(), count, parent);
        }
    } else {
        // we can't remove the rows so reset the items (i.e. the view is like a table)
        QModelIndexList list = selection.indexes();
        for (int i=0; i < list.size(); ++i) {
            QModelIndex index = list.at(i);
            QMap<int, QVariant> roles = model->itemData(index);
            for (QMap<int, QVariant>::Iterator it = roles.begin(); it != roles.end(); ++it)
                it.value() = QVariant();
            model->setItemData(index, roles);
        }
    }
#endif
}